

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

XXH32_hash_t XXH32_digest(XXH32_state_t *state_in)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  
  if (state_in->large_len == 0) {
    iVar1 = state_in->v3 + 0x165667b1;
  }
  else {
    iVar1 = (state_in->v4 << 0x12 | state_in->v4 >> 0xe) +
            (state_in->v3 << 0xc | state_in->v3 >> 0x14) +
            (state_in->v2 << 7 | state_in->v2 >> 0x19) +
            (state_in->v1 << 1 | (uint)((int)state_in->v1 < 0));
  }
  puVar4 = state_in->mem32;
  pbVar3 = (byte *)((long)state_in->mem32 + (ulong)state_in->memsize);
  uVar2 = iVar1 + state_in->total_len_32;
  puVar5 = puVar4;
  if (3 < state_in->memsize) {
    do {
      uVar2 = *puVar5 * -0x3d4d51c3 + uVar2;
      uVar2 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
      puVar4 = puVar5 + 1;
      puVar6 = puVar5 + 2;
      puVar5 = puVar4;
    } while (puVar6 <= pbVar3);
  }
  for (; puVar4 < pbVar3; puVar4 = (uint *)((long)puVar4 + 1)) {
    uVar2 = (uint)(byte)*puVar4 * 0x165667b1 + uVar2;
    uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
  }
  uVar2 = (uVar2 >> 0xf ^ uVar2) * -0x7a143589;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51c3;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

FORCE_INLINE_TEMPLATE U32 XXH32_digest_endian (const XXH32_state_t* state, XXH_endianess endian)
{
    const BYTE * p = (const BYTE*)state->mem32;
    const BYTE* const bEnd = (const BYTE*)(state->mem32) + state->memsize;
    U32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v1, 1) + XXH_rotl32(state->v2, 7) + XXH_rotl32(state->v3, 12) + XXH_rotl32(state->v4, 18);
    } else {
        h32 = state->v3 /* == seed */ + PRIME32_5;
    }

    h32 += state->total_len_32;

    while (p+4<=bEnd) {
        h32 += XXH_readLE32(p, endian) * PRIME32_3;
        h32  = XXH_rotl32(h32, 17) * PRIME32_4;
        p+=4;
    }

    while (p<bEnd) {
        h32 += (*p) * PRIME32_5;
        h32  = XXH_rotl32(h32, 11) * PRIME32_1;
        p++;
    }

    h32 ^= h32 >> 15;
    h32 *= PRIME32_2;
    h32 ^= h32 >> 13;
    h32 *= PRIME32_3;
    h32 ^= h32 >> 16;

    return h32;
}